

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O1

void __thiscall Glucose::IntOption::help(IntOption *this,bool verbose)

{
  fprintf(_stderr,"  -%-12s = %-8s [",(this->super_Option).name,(this->super_Option).type_name);
  fprintf(_stderr,"%4d");
  fwrite(" .. ",4,1,_stderr);
  if ((this->range).end == 0x7fffffff) {
    fwrite("imax",4,1,_stderr);
  }
  else {
    fprintf(_stderr,"%4d");
  }
  fprintf(_stderr,"] (default: %d)\n",(ulong)(uint)this->value);
  if (verbose) {
    fprintf(_stderr,"\n        %s\n",(this->super_Option).description);
    fputc(10,_stderr);
    return;
  }
  return;
}

Assistant:

virtual void help (bool verbose = false){
        fprintf(stderr, "  -%-12s = %-8s [", name, type_name);
        if (range.begin == INT32_MIN)
            fprintf(stderr, "imin");
        else
            fprintf(stderr, "%4d", range.begin);

        fprintf(stderr, " .. ");
        if (range.end == INT32_MAX)
            fprintf(stderr, "imax");
        else
            fprintf(stderr, "%4d", range.end);

        fprintf(stderr, "] (default: %d)\n", value);
        if (verbose){
            fprintf(stderr, "\n        %s\n", description);
            fprintf(stderr, "\n");
        }
    }